

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_edison_fab_c.c
# Opt level: O2

mraa_result_t mraa_intel_edison_uart_init_pre(int index)

{
  mraa_result_t mVar1;
  mraa_gpio_context dev;
  mraa_gpio_context dev_00;
  mraa_gpio_context dev_01;
  mraa_gpio_context dev_02;
  mraa_gpio_context dev_03;
  mraa_gpio_context dev_04;
  mraa_gpio_context dev_05;
  mraa_gpio_context dev_06;
  
  if (index == 0) {
    if (miniboard == '\0') {
      mraa_gpio_write(tristate,0);
      dev = mraa_gpio_init_raw(0xf8);
      dev_00 = mraa_gpio_init_raw(0xd8);
      dev_01 = mraa_gpio_init_raw(0xf9);
      dev_02 = mraa_gpio_init_raw(0xd9);
      dev_03 = mraa_gpio_init_raw(0xfa);
      dev_04 = mraa_gpio_init_raw(0xda);
      dev_05 = mraa_gpio_init_raw(0xfc);
      dev_06 = mraa_gpio_init_raw(0xdc);
      mraa_gpio_dir(dev,MRAA_GPIO_OUT);
      mraa_gpio_dir(dev_00,MRAA_GPIO_OUT);
      mraa_gpio_dir(dev_01,MRAA_GPIO_OUT);
      mraa_gpio_dir(dev_02,MRAA_GPIO_IN);
      mraa_gpio_dir(dev_03,MRAA_GPIO_OUT);
      mraa_gpio_dir(dev_04,MRAA_GPIO_OUT);
      mraa_gpio_dir(dev_05,MRAA_GPIO_OUT);
      mraa_gpio_dir(dev_06,MRAA_GPIO_IN);
      mraa_gpio_write(dev,0);
      mraa_gpio_write(dev_00,0);
      mraa_gpio_write(dev_01,1);
      mraa_gpio_write(dev_03,0);
      mraa_gpio_write(dev_04,0);
      mraa_gpio_write(dev_05,1);
      mraa_gpio_close(dev);
      mraa_gpio_close(dev_00);
      mraa_gpio_close(dev_01);
      mraa_gpio_close(dev_02);
      mraa_gpio_close(dev_03);
      mraa_gpio_close(dev_04);
      mraa_gpio_close(dev_05);
      mraa_gpio_close(dev_06);
    }
    mVar1 = mraa_intel_edison_pinmode_change(0x82,1);
    if (mVar1 == MRAA_SUCCESS) {
      mraa_intel_edison_pinmode_change(0x83,1);
      mraa_intel_edison_pinmode_change(0x80,1);
      mVar1 = mraa_intel_edison_pinmode_change(0x81,1);
      return mVar1;
    }
    syslog(3,"edison: Failed to preinit UART RX pin");
  }
  else {
    syslog(3,"edison: Failed to write to drive mode");
    mVar1 = MRAA_ERROR_INVALID_RESOURCE;
  }
  return mVar1;
}

Assistant:

mraa_result_t
mraa_intel_edison_uart_init_pre(int index)
{
    if (index != 0) {
        syslog(LOG_ERR, "edison: Failed to write to drive mode");
        return MRAA_ERROR_INVALID_RESOURCE;
    }
    if (miniboard == 0) {
        mraa_gpio_write(tristate, 0);
        mraa_gpio_context io0_output = mraa_gpio_init_raw(248);
        mraa_gpio_context io0_pullup = mraa_gpio_init_raw(216);
        mraa_gpio_context io1_output = mraa_gpio_init_raw(249);
        mraa_gpio_context io1_pullup = mraa_gpio_init_raw(217);
        mraa_gpio_context io2_output = mraa_gpio_init_raw(250); /* CTS */
        mraa_gpio_context io2_pullup = mraa_gpio_init_raw(218);
        mraa_gpio_context io4_output = mraa_gpio_init_raw(252); /* RTS */
        mraa_gpio_context io4_pullup = mraa_gpio_init_raw(220);

        mraa_gpio_dir(io0_output, MRAA_GPIO_OUT);
        mraa_gpio_dir(io0_pullup, MRAA_GPIO_OUT);
        mraa_gpio_dir(io1_output, MRAA_GPIO_OUT);
        mraa_gpio_dir(io1_pullup, MRAA_GPIO_IN);
        mraa_gpio_dir(io2_output, MRAA_GPIO_OUT);
        mraa_gpio_dir(io2_pullup, MRAA_GPIO_OUT);
        mraa_gpio_dir(io4_output, MRAA_GPIO_OUT);
        mraa_gpio_dir(io4_pullup, MRAA_GPIO_IN);


        mraa_gpio_write(io0_output, 0);
        mraa_gpio_write(io0_pullup, 0);
        mraa_gpio_write(io1_output, 1);
        mraa_gpio_write(io2_output, 0);
        mraa_gpio_write(io2_pullup, 0);
        mraa_gpio_write(io4_output, 1);


        mraa_gpio_close(io0_output);
        mraa_gpio_close(io0_pullup);
        mraa_gpio_close(io1_output);
        mraa_gpio_close(io1_pullup);
        mraa_gpio_close(io2_output);
        mraa_gpio_close(io2_pullup);
        mraa_gpio_close(io4_output);
        mraa_gpio_close(io4_pullup);

    }

    mraa_result_t ret;
    ret = mraa_intel_edison_pinmode_change(130, 1); // IO0 RX
    if (ret != MRAA_SUCCESS) {
        syslog(LOG_ERR, "edison: Failed to preinit UART RX pin");
        return ret;
    }
    ret = mraa_intel_edison_pinmode_change(131, 1); // IO1 TX
    ret = mraa_intel_edison_pinmode_change(128, 1); // IO2 CTS
    ret = mraa_intel_edison_pinmode_change(129, 1); // IO4 RTS
    return ret;
}